

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_disk_posix.c
# Opt level: O3

wchar_t cleanup_pathname_fsobj(char *path,wchar_t *a_eno,archive_string *a_estr,wchar_t flags)

{
  char cVar1;
  bool bVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  long lVar6;
  
  pcVar3 = path;
  if (*path == '/') {
    if (((uint)flags >> 0x10 & 1) == 0) {
      pcVar4 = path + 1;
      bVar2 = false;
      goto LAB_0050cf11;
    }
    if (a_eno != (wchar_t *)0x0) {
      *a_eno = L'\xffffffff';
    }
    if (a_estr == (archive_string *)0x0) {
      return L'\xffffffe7';
    }
    pcVar3 = "Path is ";
    pcVar4 = "absolute";
  }
  else {
    bVar2 = true;
    pcVar4 = path;
    if (*path != '\0') {
LAB_0050cf11:
      do {
        while (cVar1 = *pcVar4, cVar1 != '.') {
          lVar6 = 1;
          if (cVar1 == '/') goto LAB_0050cf3f;
          if (cVar1 == '\0') goto LAB_0050cf8e;
LAB_0050cf65:
          pcVar5 = pcVar4;
          if (bVar2) goto LAB_0050cf6f;
          *pcVar3 = '/';
          while( true ) {
            pcVar3 = pcVar3 + 1;
            pcVar5 = pcVar4;
LAB_0050cf6f:
            pcVar4 = pcVar5 + 1;
            cVar1 = *pcVar5;
            if (cVar1 == '\0') goto LAB_0050cf8e;
            if (cVar1 == '/') break;
            *pcVar3 = cVar1;
          }
          bVar2 = false;
        }
        cVar1 = pcVar4[1];
        lVar6 = 2;
        if (cVar1 != '/') {
          if (cVar1 != '\0') {
            if ((cVar1 != '.') ||
               (((pcVar4[2] != '/' && (pcVar4[2] != '\0')) || (((uint)flags >> 9 & 1) == 0))))
            goto LAB_0050cf65;
            if (a_eno != (wchar_t *)0x0) {
              *a_eno = L'\xffffffff';
            }
            if (a_estr == (archive_string *)0x0) {
              return L'\xffffffe7';
            }
            pcVar3 = "Path contains ";
            pcVar4 = "\'..\'";
            goto LAB_0050cfd1;
          }
LAB_0050cf8e:
          if (pcVar3 == path) {
            *path = bVar2 ^ 0x2f;
            pcVar3 = path + 1;
          }
          *pcVar3 = '\0';
          return L'\0';
        }
LAB_0050cf3f:
        pcVar4 = pcVar4 + lVar6;
      } while( true );
    }
    if (a_eno != (wchar_t *)0x0) {
      *a_eno = L'\xffffffff';
    }
    if (a_estr == (archive_string *)0x0) {
      return L'\xffffffe7';
    }
    pcVar3 = "Invalid empty ";
    pcVar4 = "pathname";
  }
LAB_0050cfd1:
  archive_string_sprintf(a_estr,"%s%s",pcVar3,pcVar4);
  return L'\xffffffe7';
}

Assistant:

static int
cleanup_pathname_fsobj(char *path, int *a_eno, struct archive_string *a_estr,
    int flags)
{
	char *dest, *src;
	char separator = '\0';

	dest = src = path;
	if (*src == '\0') {
		fsobj_error(a_eno, a_estr, ARCHIVE_ERRNO_MISC,
		    "Invalid empty ", "pathname");
		return (ARCHIVE_FAILED);
	}

#if defined(__CYGWIN__)
	cleanup_pathname_win(path);
#endif
	/* Skip leading '/'. */
	if (*src == '/') {
		if (flags & ARCHIVE_EXTRACT_SECURE_NOABSOLUTEPATHS) {
			fsobj_error(a_eno, a_estr, ARCHIVE_ERRNO_MISC,
			    "Path is ", "absolute");
			return (ARCHIVE_FAILED);
		}

		separator = *src++;
	}

	/* Scan the pathname one element at a time. */
	for (;;) {
		/* src points to first char after '/' */
		if (src[0] == '\0') {
			break;
		} else if (src[0] == '/') {
			/* Found '//', ignore second one. */
			src++;
			continue;
		} else if (src[0] == '.') {
			if (src[1] == '\0') {
				/* Ignore trailing '.' */
				break;
			} else if (src[1] == '/') {
				/* Skip './'. */
				src += 2;
				continue;
			} else if (src[1] == '.') {
				if (src[2] == '/' || src[2] == '\0') {
					/* Conditionally warn about '..' */
					if (flags
					    & ARCHIVE_EXTRACT_SECURE_NODOTDOT) {
						fsobj_error(a_eno, a_estr,
						    ARCHIVE_ERRNO_MISC,
						    "Path contains ", "'..'");
						return (ARCHIVE_FAILED);
					}
				}
				/*
				 * Note: Under no circumstances do we
				 * remove '..' elements.  In
				 * particular, restoring
				 * '/foo/../bar/' should create the
				 * 'foo' dir as a side-effect.
				 */
			}
		}

		/* Copy current element, including leading '/'. */
		if (separator)
			*dest++ = '/';
		while (*src != '\0' && *src != '/') {
			*dest++ = *src++;
		}

		if (*src == '\0')
			break;

		/* Skip '/' separator. */
		separator = *src++;
	}
	/*
	 * We've just copied zero or more path elements, not including the
	 * final '/'.
	 */
	if (dest == path) {
		/*
		 * Nothing got copied.  The path must have been something
		 * like '.' or '/' or './' or '/././././/./'.
		 */
		if (separator)
			*dest++ = '/';
		else
			*dest++ = '.';
	}
	/* Terminate the result. */
	*dest = '\0';
	return (ARCHIVE_OK);
}